

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
interfaces::MakeCleanupHandler(interfaces *this,function<void_()> cleanup)

{
  code *pcVar1;
  undefined8 *puVar2;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (undefined8 *)operator_new(0x28);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = (code *)0x0;
  uStack_30 = in_RSI[3];
  pcVar1 = (code *)in_RSI[2];
  if (pcVar1 != (code *)0x0) {
    local_48 = *in_RSI;
    uStack_40 = in_RSI[1];
    in_RSI[2] = 0;
    in_RSI[3] = 0;
    local_38 = pcVar1;
  }
  *puVar2 = &PTR__CleanupHandler_006cb8d0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = uStack_30;
  if (local_38 != (code *)0x0) {
    puVar2[1] = local_48;
    puVar2[2] = uStack_40;
    puVar2[3] = local_38;
    local_38 = (code *)0x0;
    uStack_30 = 0;
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  *(undefined8 **)this = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeCleanupHandler(std::function<void()> cleanup)
{
    return std::make_unique<common::CleanupHandler>(std::move(cleanup));
}